

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O1

void QTimer::singleShotImpl
               (nanoseconds ns,TimerType timerType,QObject *receiver,QSlotObjectBase *slotObj)

{
  bool bVar1;
  QSingleShotTimer *this;
  QThread *pQVar2;
  QThread *pQVar3;
  long in_FS_OFFSET;
  void *local_48;
  char *pcStack_40;
  QMetaTypeInterface *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (ns.__r == 0) {
    if (receiver == (QObject *)0x0) {
      pQVar2 = QThread::currentThread();
      pQVar3 = QCoreApplicationPrivate::mainThread();
      if (pQVar2 == pQVar3) {
        bVar1 = false;
        receiver = &QThread::currentThread()->super_QObject;
      }
      else {
        receiver = (QObject *)operator_new(0x10);
        bVar1 = true;
        QObject::QObject(receiver,(QObject *)0x0);
      }
    }
    else {
      bVar1 = false;
    }
    local_48 = (void *)0x0;
    pcStack_40 = (char *)0x0;
    local_38 = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              (receiver,slotObj,QueuedConnection,1,&local_48,&pcStack_40,&local_38);
    if (bVar1) {
      QObject::deleteLater(receiver);
    }
  }
  else {
    this = (QSingleShotTimer *)operator_new(0x18);
    QSingleShotTimer::QSingleShotTimer(this,(Duration)ns.__r,timerType,receiver,slotObj);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimer::singleShotImpl(std::chrono::nanoseconds ns, Qt::TimerType timerType,
                            const QObject *receiver,
                            QtPrivate::QSlotObjectBase *slotObj)
{
    if (ns == 0ns) {
        bool deleteReceiver = false;
        // Optimize: set a receiver context when none is given, such that we can use
        // QMetaObject::invokeMethod which is more efficient than going through a timer.
        // We need a QObject living in the current thread. But the QThread itself lives
        // in a different thread - with the exception of the main QThread which lives in
        // itself. And QThread::currentThread() is among the few QObjects we know that will
        // most certainly be there. Note that one can actually call singleShot before the
        // QApplication is created!
        if (!receiver && QThread::currentThread() == QCoreApplicationPrivate::mainThread()) {
            // reuse main thread as context object
            receiver = QThread::currentThread();
        } else if (!receiver) {
            // Create a receiver context object on-demand. According to the benchmarks,
            // this is still more efficient than going through a timer.
            receiver = new QObject;
            deleteReceiver = true;
        }

        auto h = QtPrivate::invokeMethodHelper({});
        QMetaObject::invokeMethodImpl(const_cast<QObject *>(receiver), slotObj,
                Qt::QueuedConnection, h.parameterCount(), h.parameters.data(), h.typeNames.data(),
                h.metaTypes.data());

        if (deleteReceiver)
            const_cast<QObject *>(receiver)->deleteLater();
        return;
    }

    (void) new QSingleShotTimer(ns, timerType, receiver, slotObj);
}